

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_string_as_array(void)

{
  error_code eVar1;
  int local_1d8 [2];
  error_category *local_1d0;
  type local_1c0;
  undefined1 local_1a8 [8];
  error_code error_3;
  variable data_3;
  type local_150;
  undefined1 local_138 [8];
  error_code error_2;
  variable data_2;
  type local_e0;
  undefined1 local_c8 [8];
  error_code error_1;
  variable data_1;
  int local_78 [2];
  error_category *local_70;
  type local_60;
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,"alpha");
  std::error_code::error_code((error_code *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<trial::dynamic::basic_array<std::allocator<char>>>
            (&local_60,(basic_variable<std::allocator<char>> *)&error._M_cat,(error_code *)local_48)
  ;
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_60);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_70 = eVar1._M_cat;
  local_78[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x180c,"void value_suite::fail_string_as_array()",local_48,local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,L"bravo");
  std::error_code::error_code((error_code *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<trial::dynamic::basic_array<std::allocator<char>>>
            (&local_e0,(basic_variable<std::allocator<char>> *)&error_1._M_cat,
             (error_code *)local_c8);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  data_2.storage._40_4_ = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1812,"void value_suite::fail_string_as_array()",local_c8,&data_2.storage.field_0x28)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat,L"charlie");
  std::error_code::error_code((error_code *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<trial::dynamic::basic_array<std::allocator<char>>>
            (&local_150,(basic_variable<std::allocator<char>> *)&error_2._M_cat,
             (error_code *)local_138);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_150);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  data_3.storage._40_4_ = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1818,"void value_suite::fail_string_as_array()",local_138,&data_3.storage.field_0x28
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat,L"delta");
  std::error_code::error_code((error_code *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<trial::dynamic::basic_array<std::allocator<char>>>
            (&local_1c0,(basic_variable<std::allocator<char>> *)&error_3._M_cat,
             (error_code *)local_1a8);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_1d0 = eVar1._M_cat;
  local_1d8[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x181e,"void value_suite::fail_string_as_array()",local_1a8,local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat);
  return;
}

Assistant:

void fail_string_as_array()
{
    {
        variable data("alpha");
        std::error_code error;
        data.value<array>(error);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(L"bravo");
        std::error_code error;
        data.value<array>(error);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(u"charlie");
        std::error_code error;
        data.value<array>(error);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(U"delta");
        std::error_code error;
        data.value<array>(error);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
}